

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O0

QString * __thiscall
SecurityDirWrapper::getFieldName
          (QString *__return_storage_ptr__,SecurityDirWrapper *this,size_t fieldId)

{
  size_t fieldId_local;
  SecurityDirWrapper *this_local;
  
  switch(fieldId) {
  case 0:
    QString::QString(__return_storage_ptr__,"Length");
    break;
  case 1:
    QString::QString(__return_storage_ptr__,"Revision");
    break;
  case 2:
    QString::QString(__return_storage_ptr__,"Type");
    break;
  case 3:
    QString::QString(__return_storage_ptr__,"Cert. Content");
    break;
  default:
    (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QString SecurityDirWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case CERT_LEN : return "Length";
        case REVISION : return "Revision";
        case TYPE : return "Type";
        case CERT_CONTENT : return "Cert. Content";
    }
    return getName();
}